

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImagePaletteCopy(gdImagePtr to,gdImagePtr from)

{
  int iVar1;
  int aiStack_428 [2];
  int xlate [256];
  int p;
  int y;
  int x;
  int i;
  gdImagePtr from_local;
  gdImagePtr to_local;
  
  if ((to->trueColor == 0) && (from->trueColor == 0)) {
    for (y = 0; y < 0x100; y = y + 1) {
      aiStack_428[y] = -1;
    }
    for (xlate[0xff] = 0; xlate[0xff] < to->sy; xlate[0xff] = xlate[0xff] + 1) {
      for (p = 0; p < to->sx; p = p + 1) {
        xlate[0xfe] = (int)to->pixels[xlate[0xff]][p];
        if (aiStack_428[xlate[0xfe]] == -1) {
          iVar1 = gdImageColorClosestAlpha
                            (from,to->red[xlate[0xfe]],to->green[xlate[0xfe]],to->blue[xlate[0xfe]],
                             to->alpha[xlate[0xfe]]);
          aiStack_428[xlate[0xfe]] = iVar1;
        }
        to->pixels[xlate[0xff]][p] = (uchar)aiStack_428[xlate[0xfe]];
      }
    }
    for (y = 0; y < from->colorsTotal; y = y + 1) {
      to->red[y] = from->red[y];
      to->blue[y] = from->blue[y];
      to->green[y] = from->green[y];
      to->alpha[y] = from->alpha[y];
      to->open[y] = 0;
    }
    for (y = from->colorsTotal; y < to->colorsTotal; y = y + 1) {
      to->open[y] = 1;
    }
    to->colorsTotal = from->colorsTotal;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImagePaletteCopy (gdImagePtr to, gdImagePtr from)
{
	int i;
	int x, y, p;
	int xlate[256];
	if (to->trueColor) {
		return;
	}
	if (from->trueColor) {
		return;
	}

	for (i = 0; i < 256; i++) {
		xlate[i] = -1;
	};

	for (y = 0; y < (to->sy); y++) {
		for (x = 0; x < (to->sx); x++) {
			/* Optimization: no gdImageGetPixel */
			p = to->pixels[y][x];
			if (xlate[p] == -1) {
				/* This ought to use HWB, but we don't have an alpha-aware
				   version of that yet. */
				xlate[p] =
				    gdImageColorClosestAlpha (from, to->red[p], to->green[p],
				                              to->blue[p], to->alpha[p]);
				/*printf("Mapping %d (%d, %d, %d, %d) to %d (%d, %d, %d, %d)\n", */
				/*      p,  to->red[p], to->green[p], to->blue[p], to->alpha[p], */
				/*      xlate[p], from->red[xlate[p]], from->green[xlate[p]], from->blue[xlate[p]], from->alpha[xlate[p]]); */
			};
			/* Optimization: no gdImageSetPixel */
			to->pixels[y][x] = xlate[p];
		};
	};

	for (i = 0; (i < (from->colorsTotal)); i++) {
		/*printf("Copying color %d (%d, %d, %d, %d)\n", i, from->red[i], from->blue[i], from->green[i], from->alpha[i]); */
		to->red[i] = from->red[i];
		to->blue[i] = from->blue[i];
		to->green[i] = from->green[i];
		to->alpha[i] = from->alpha[i];
		to->open[i] = 0;
	};

	for (i = from->colorsTotal; (i < to->colorsTotal); i++) {
		to->open[i] = 1;
	};

	to->colorsTotal = from->colorsTotal;

}